

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O2

void __thiscall NaStateSpaceModel::Load(NaStateSpaceModel *this,NaDataStream *ds)

{
  NaMatrix *pNVar1;
  NaVector *this_00;
  NaStateSpaceModel *pNVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  NaReal *pNVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  double dVar9;
  char *p;
  char *local_40;
  NaStateSpaceModel *local_38;
  
  uVar8 = 0;
  NaDataStream::GetF(ds,"%u %u %u",&this->n,&this->m,&this->k);
  NaPrintLog("N=%d  M=%d  K=%d\n",(ulong)this->n,(ulong)this->m);
  pNVar1 = &this->A;
  local_38 = this;
  NaMatrix::new_dim(pNVar1,this->n,this->n);
  while( true ) {
    uVar3 = NaMatrix::dim_rows(pNVar1);
    if (uVar3 <= uVar8) break;
    iVar4 = (*ds->_vptr_NaDataStream[3])(ds);
    uVar6 = 0;
    pcVar7 = (char *)CONCAT44(extraout_var,iVar4);
    while( true ) {
      uVar3 = NaMatrix::dim_cols(pNVar1);
      if (uVar3 <= uVar6) break;
      dVar9 = strtod(pcVar7,&local_40);
      pNVar5 = NaMatrix::operator[](pNVar1,uVar8);
      pNVar5[uVar6] = dVar9;
      uVar6 = uVar6 + 1;
      pcVar7 = local_40;
    }
    uVar8 = uVar8 + 1;
  }
  NaMatrix::print_contents(pNVar1);
  pNVar1 = &local_38->B;
  NaMatrix::new_dim(pNVar1,local_38->n,local_38->k);
  uVar8 = 0;
  while( true ) {
    uVar3 = NaMatrix::dim_rows(pNVar1);
    if (uVar3 <= uVar8) break;
    iVar4 = (*ds->_vptr_NaDataStream[3])(ds);
    uVar6 = 0;
    pcVar7 = (char *)CONCAT44(extraout_var_00,iVar4);
    while( true ) {
      uVar3 = NaMatrix::dim_cols(pNVar1);
      if (uVar3 <= uVar6) break;
      dVar9 = strtod(pcVar7,&local_40);
      pNVar5 = NaMatrix::operator[](pNVar1,uVar8);
      pNVar5[uVar6] = dVar9;
      uVar6 = uVar6 + 1;
      pcVar7 = local_40;
    }
    uVar8 = uVar8 + 1;
  }
  NaMatrix::print_contents(pNVar1);
  pNVar1 = &local_38->C;
  NaMatrix::new_dim(pNVar1,local_38->m,local_38->n);
  uVar8 = 0;
  while( true ) {
    uVar3 = NaMatrix::dim_rows(pNVar1);
    if (uVar3 <= uVar8) break;
    iVar4 = (*ds->_vptr_NaDataStream[3])(ds);
    uVar6 = 0;
    pcVar7 = (char *)CONCAT44(extraout_var_01,iVar4);
    while( true ) {
      uVar3 = NaMatrix::dim_cols(pNVar1);
      if (uVar3 <= uVar6) break;
      dVar9 = strtod(pcVar7,&local_40);
      pNVar5 = NaMatrix::operator[](pNVar1,uVar8);
      pNVar5[uVar6] = dVar9;
      uVar6 = uVar6 + 1;
      pcVar7 = local_40;
    }
    uVar8 = uVar8 + 1;
  }
  NaMatrix::print_contents(pNVar1);
  pNVar1 = &local_38->D;
  NaMatrix::new_dim(pNVar1,local_38->m,local_38->k);
  uVar8 = 0;
  while( true ) {
    uVar3 = NaMatrix::dim_rows(pNVar1);
    if (uVar3 <= uVar8) break;
    iVar4 = (*ds->_vptr_NaDataStream[3])(ds);
    uVar6 = 0;
    pcVar7 = (char *)CONCAT44(extraout_var_02,iVar4);
    while( true ) {
      uVar3 = NaMatrix::dim_cols(pNVar1);
      if (uVar3 <= uVar6) break;
      dVar9 = strtod(pcVar7,&local_40);
      pNVar5 = NaMatrix::operator[](pNVar1,uVar8);
      pNVar5[uVar6] = dVar9;
      uVar6 = uVar6 + 1;
      pcVar7 = local_40;
    }
    uVar8 = uVar8 + 1;
  }
  NaMatrix::print_contents(pNVar1);
  pNVar2 = local_38;
  NaVector::new_dim(&local_38->x,local_38->n);
  this_00 = &pNVar2->x0;
  NaVector::new_dim(this_00,pNVar2->n);
  iVar4 = (*ds->_vptr_NaDataStream[3])(ds);
  uVar8 = 0;
  pcVar7 = (char *)CONCAT44(extraout_var_03,iVar4);
  while( true ) {
    uVar3 = NaVector::dim(this_00);
    if (uVar3 <= uVar8) break;
    dVar9 = strtod(pcVar7,&local_40);
    pNVar5 = NaVector::operator[](this_00,uVar8);
    *pNVar5 = dVar9;
    uVar8 = uVar8 + 1;
    pcVar7 = local_40;
  }
  NaVector::print_contents(this_00);
  NaUnit::Assign(&local_38->super_NaUnit,local_38->k,local_38->m,0);
  return;
}

Assistant:

void
NaStateSpaceModel::Load (NaDataStream& ds)
{
    char        *szBuf, *s, *p;
    unsigned     i, j;

    ds.GetF("%u %u %u", &n, &m, &k);
    NaPrintLog("N=%d  M=%d  K=%d\n", n, m, k);

    A.new_dim(n, n);
    for(i = 0; i < A.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < A.dim_cols(); ++j){
            A[i][j] = strtod(s, &p);
            s = p;
        }
    }
    A.print_contents();

    B.new_dim(n, k);
    for(i = 0; i < B.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < B.dim_cols(); ++j){
            B[i][j] = strtod(s, &p);
            s = p;
        }
    }
    B.print_contents();

    C.new_dim(m, n);
    for(i = 0; i < C.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < C.dim_cols(); ++j){
            C[i][j] = strtod(s, &p);
            s = p;
        }
    }
    C.print_contents();

    D.new_dim(m, k);
    for(i = 0; i < D.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < D.dim_cols(); ++j){
            D[i][j] = strtod(s, &p);
            s = p;
        }
    }
    D.print_contents();

    // Just to have right dimension
    x.new_dim(n);

    x0.new_dim(n);
    szBuf = ds.GetData();
    s = szBuf;
    for(i = 0; i < x0.dim(); ++i){
	x0[i] = strtod(s, &p);
	s = p;
    }
    x0.print_contents();

    Assign(k, m);
}